

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O2

StatusOr<long> __thiscall
google::protobuf::json_internal::UnparseProto3Type::GetInt64
          (UnparseProto3Type *this,Field f,Msg *msg,size_t idx)

{
  reference plVar1;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 extraout_RDX;
  StatusOr<long> SVar2;
  Span<const_long> local_20;
  
  local_20 = UntypedMessage::Get<long>(msg,(f->raw_->field_0)._impl_.number_);
  plVar1 = absl::lts_20240722::Span<const_long>::operator[](&local_20,idx);
  *(long *)(this + 8) = *plVar1;
  *(undefined8 *)this = 1;
  SVar2.super_StatusOrData<long>.field_1.data_ = extraout_RDX.data_;
  SVar2.super_StatusOrData<long>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)this;
  return (StatusOr<long>)SVar2.super_StatusOrData<long>;
}

Assistant:

static absl::StatusOr<int64_t> GetInt64(Field f, const Msg& msg,
                                          size_t idx = 0) {
    return msg.Get<int64_t>(f->proto().number())[idx];
  }